

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

char inside_shop(level *lev,xchar x,xchar y)

{
  char rno;
  xchar y_local;
  xchar x_local;
  level *lev_local;
  
  lev_local._7_1_ = (byte)((uint)*(undefined4 *)&lev->locations[x][y].field_0x6 >> 0x10) & 0x3f;
  if (((lev_local._7_1_ < 3) || ((*(uint *)&lev->locations[x][y].field_0x6 >> 0x16 & 1) != 0)) ||
     (lev->rooms[(char)lev_local._7_1_ + -3].rtype < '\x12')) {
    lev_local._7_1_ = 0;
  }
  return lev_local._7_1_;
}

Assistant:

char inside_shop(struct level *lev, xchar x, xchar y)
{
	char rno;

	rno = lev->locations[x][y].roomno;
	if ((rno < ROOMOFFSET) || lev->locations[x][y].edge || !IS_SHOP(lev, rno-ROOMOFFSET))
	    return NO_ROOM;
	else
	    return rno;
}